

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  void *returnvalue;
  undefined8 uVar3;
  void *returnvalue_00;
  void *returnvalue_01;
  void *returnvalue_02;
  void *returnvalue_03;
  double *pdVar4;
  long lVar5;
  int *jig;
  int iVar6;
  long lVar7;
  double *pdVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int *jr;
  double *pdVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int retval;
  double local_a0;
  void *local_98;
  int ncheck;
  double local_88;
  double dStack_80;
  void *local_78;
  sunrealtype t;
  int indexB;
  undefined8 local_40;
  
  retval = SUNContext_Create(0,&sunctx);
  iVar9 = 1;
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 == 0) {
    returnvalue = malloc(0x9948);
    for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
      uVar3 = SUNDlsMat_newDenseMat(6,6);
      *(undefined8 *)((long)returnvalue + lVar16 * 8) = uVar3;
      uVar3 = SUNDlsMat_newIndexArray(6);
      *(undefined8 *)((long)returnvalue + lVar16 * 8 + 0x20) = uVar3;
    }
    uVar3 = N_VNew_Serial(0x960,sunctx);
    *(undefined8 *)((long)returnvalue + 0x9928) = uVar3;
    uVar3 = N_VNew_Serial(0x960,sunctx);
    *(undefined8 *)((long)returnvalue + 0x9930) = uVar3;
    iVar2 = check_retval(returnvalue,"AllocUserData",2);
    if (iVar2 == 0) {
      lVar16 = (long)returnvalue + 0x130;
      *(undefined4 *)((long)returnvalue + 0x40) = 6;
      lVar7 = lVar16;
      for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
        for (lVar10 = 0; lVar10 != 0x120; lVar10 = lVar10 + 0x30) {
          *(undefined8 *)(lVar7 + lVar10) = 0;
        }
        lVar7 = lVar7 + 8;
      }
      jig = (int *)((long)returnvalue + 0x1c0);
      jr = (int *)0x40c3880000000000;
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        for (lVar5 = -0x90; lVar5 != 0; lVar5 = lVar5 + 0x30) {
          *(undefined8 *)((long)jig + lVar5 + 0x90) = 0x40c3880000000000;
          *(undefined8 *)((long)jig + lVar5 + 0x18) = 0xbea0c6f7a0b5ed8d;
        }
        *(undefined8 *)(lVar7 * 0x38 + lVar16) = 0xbff0000000000000;
        *(undefined8 *)((lVar7 + 3) * 0x38 + lVar16) = 0xbff0000000000000;
        *(undefined8 *)((long)returnvalue + lVar7 * 8 + 0x250) = 0x3ff0000000000000;
        *(undefined8 *)((long)returnvalue + lVar7 * 8 + 0x268) = 0xbff0000000000000;
        *(undefined8 *)((long)returnvalue + lVar7 * 8 + 0x280) = 0x3ff0000000000000;
        *(undefined8 *)((long)returnvalue + lVar7 * 8 + 0x298) = 0x3fe0000000000000;
        jig = jig + 2;
      }
      *(undefined4 *)((long)returnvalue + 0x44) = 0x78;
      *(undefined8 *)((long)returnvalue + 0x310) = 0x3faaf286bca1af28;
      *(undefined8 *)((long)returnvalue + 0x318) = 0x3faaf286bca1af28;
      for (lVar16 = 0x50; lVar16 != 0x56; lVar16 = lVar16 + 1) {
        dVar18 = *(double *)((long)returnvalue + lVar16 * 8) / 0.0027700831024930744;
        *(double *)((long)returnvalue + lVar16 * 8 + 0x30) = dVar18;
        *(double *)((long)returnvalue + lVar16 * 8 + 0x60) = dVar18;
      }
      *(undefined8 *)((long)returnvalue + 0x48) = 0x19000000006;
      *(undefined8 *)((long)returnvalue + 0x50) = 0x1400000014;
      *(undefined8 *)((long)returnvalue + 800) = 0x3e50000000000000;
      *(undefined8 *)((long)returnvalue + 0x58) = 0x200000004;
      *(undefined8 *)((long)returnvalue + 0x60) = 0x7800000002;
      iVar2 = (int)returnvalue;
      SetGroups(iVar2 + 0x68,iVar2 + 0x80,(int *)((long)returnvalue + 0x120),jig,
                (int *)0x40c3880000000000);
      SetGroups(iVar2 + 0x74,iVar2 + 0xd0,(int *)((long)returnvalue + 0x128),jig,jr);
      returnvalue_00 = (void *)N_VNew_Serial(0x960,sunctx);
      lVar16 = 0;
      iVar2 = check_retval(returnvalue_00,"N_VNew_Serial",0);
      if (iVar2 == 0) {
        lVar7 = N_VGetArrayPointer(returnvalue_00);
        uVar1 = *(uint *)((long)returnvalue + 0x40);
        iVar2 = *(int *)((long)returnvalue + 0x44);
        dVar18 = *(double *)((long)returnvalue + 0x310);
        dVar19 = *(double *)((long)returnvalue + 0x318);
        uVar11 = 0;
        if (0 < (int)uVar1) {
          uVar11 = (ulong)uVar1;
        }
        for (; lVar16 != 0x14; lVar16 = lVar16 + 1) {
          dVar20 = (double)(int)lVar16 * dVar19;
          dVar20 = dVar20 * 4.0 * (1.0 - dVar20);
          lVar5 = lVar7;
          for (lVar10 = 0; lVar10 != 0x14; lVar10 = lVar10 + 1) {
            dVar21 = (double)(int)lVar10 * dVar18;
            dVar21 = dVar21 * 4.0 * (1.0 - dVar21);
            uVar17 = 0;
            while (uVar11 != uVar17) {
              *(double *)(lVar5 + uVar17 * 8) =
                   (double)(int)(uVar17 + 1) * dVar21 * dVar21 * dVar20 * dVar20 + 10.0;
              uVar17 = uVar17 + 1;
            }
            lVar5 = lVar5 + (long)(int)uVar1 * 8;
          }
          lVar7 = lVar7 + (long)iVar2 * 8;
        }
        puts("\nCreate and allocate CVODES memory for forward run");
        returnvalue_01 = (void *)CVodeCreate(2,sunctx);
        local_78 = returnvalue_01;
        iVar2 = check_retval(returnvalue_01,"CVodeCreate",0);
        if (iVar2 == 0) {
          *(void **)((long)returnvalue + 0x9938) = returnvalue_01;
          retval = CVodeSetUserData(returnvalue_01,returnvalue);
          iVar9 = 1;
          iVar2 = check_retval(&retval,"CVodeSetUserData",1);
          if (iVar2 == 0) {
            retval = CVodeInit(0,returnvalue_01,f,returnvalue_00);
            iVar9 = 1;
            iVar2 = check_retval(&retval,"CVodeInit",1);
            if (iVar2 == 0) {
              retval = CVodeSStolerances(0x88e368f1,0x3ee4f8b588e368f1,returnvalue_01);
              iVar9 = 1;
              iVar2 = check_retval(&retval,"CVodeSStolerances",1);
              if (iVar2 == 0) {
                iVar9 = 1;
                returnvalue_02 = (void *)SUNLinSol_SPGMR(returnvalue_00,1,0,sunctx);
                iVar2 = check_retval(returnvalue_02,"SUNLinSol_SPGMR",0);
                if (iVar2 == 0) {
                  retval = CVodeSetLinearSolver(returnvalue_01,returnvalue_02,0);
                  iVar9 = 1;
                  iVar2 = check_retval(&retval,"CVodeSetLinearSolver",1);
                  if (iVar2 == 0) {
                    retval = CVodeSetPreconditioner(returnvalue_01,Precond,PSolve);
                    iVar9 = 1;
                    iVar2 = check_retval(&retval,"CVodeSetPreconditioner",1);
                    if (iVar2 == 0) {
                      retval = CVodeSetMaxNumSteps(returnvalue_01,0x9c4);
                      iVar9 = 1;
                      iVar2 = check_retval(&retval,"CVodeSetMaxNumSteps",1);
                      if (iVar2 == 0) {
                        puts("\nAllocate global memory");
                        iVar9 = 1;
                        retval = CVodeAdjInit(returnvalue_01,0x50,1);
                        iVar2 = check_retval(&retval,"CVodeAdjInit",1);
                        if (iVar2 == 0) {
                          puts("\nForward integration");
                          iVar9 = 1;
                          retval = CVodeF(0,returnvalue_01,returnvalue_00,&t,1,&ncheck);
                          iVar2 = check_retval(&retval,"CVodeF",1);
                          if (iVar2 == 0) {
                            printf("\nncheck = %d\n",(ulong)(uint)ncheck);
                            lVar7 = N_VGetArrayPointer(returnvalue_00);
                            iVar2 = *(int *)((long)returnvalue + 0x40);
                            iVar6 = *(int *)((long)returnvalue + 0x44);
                            dVar18 = *(double *)(lVar7 + 0x28);
                            lVar5 = (long)*(int *)((long)returnvalue + 0x50) + -1;
                            pdVar14 = (double *)(lVar7 + (long)iVar2 * 8 + 0x28);
                            for (lVar16 = 1; lVar16 < lVar5; lVar16 = lVar16 + 1) {
                              dVar18 = dVar18 + *pdVar14 + *pdVar14;
                              pdVar14 = pdVar14 + iVar2;
                            }
                            iVar13 = (int)lVar5 * iVar2;
                            local_88 = (double)CONCAT44(local_88._4_4_,iVar13 + 5);
                            local_98 = (void *)(lVar7 + (long)iVar13 * 8 + 0x28);
                            dVar19 = *(double *)((long)returnvalue + 0x310) * 0.5;
                            dVar18 = (dVar18 + *(double *)(lVar7 + 0x28 + (long)iVar13 * 8)) *
                                     dVar19;
                            local_a0 = (double)((long)*(int *)((long)returnvalue + 0x54) + -1);
                            iVar15 = iVar6 + iVar2 + 5;
                            for (lVar16 = 1; lVar16 < (long)local_a0; lVar16 = lVar16 + 1) {
                              dVar20 = *(double *)(lVar7 + 0x28 + lVar16 * iVar6 * 8);
                              iVar12 = iVar15;
                              for (lVar10 = 1; lVar10 < lVar5; lVar10 = lVar10 + 1) {
                                dVar21 = *(double *)(lVar7 + (long)iVar12 * 8);
                                dVar20 = dVar20 + dVar21 + dVar21;
                                iVar12 = iVar12 + iVar2;
                              }
                              dVar20 = (dVar20 + *(double *)((long)local_98 + lVar16 * iVar6 * 8)) *
                                       dVar19;
                              dVar18 = dVar18 + dVar20 + dVar20;
                              iVar15 = iVar15 + iVar6;
                            }
                            iVar6 = iVar6 * local_a0._0_4_;
                            dVar20 = *(double *)(lVar7 + 0x28 + (long)iVar6 * 8);
                            iVar15 = iVar6 + iVar2 + 5;
                            for (lVar16 = 1; lVar16 < lVar5; lVar16 = lVar16 + 1) {
                              dVar21 = *(double *)(lVar7 + (long)iVar15 * 8);
                              dVar20 = dVar20 + dVar21 + dVar21;
                              iVar15 = iVar15 + iVar2;
                            }
                            printf("\n   g = int_x int_y c%d(Tfinal,x,y) dx dy = %f \n\n",
                                   SUB84(*(double *)((long)returnvalue + 0x318) * 0.5 *
                                         (dVar18 + dVar19 * (dVar20 + *(double *)
                                                                       (lVar7 + (long)(iVar13 + 5 +
                                                                                      iVar6) * 8))),
                                         0),6);
                            local_98 = (void *)N_VNew_Serial(0x960,sunctx);
                            local_a0 = 0.0;
                            iVar2 = check_retval(local_98,"N_VNew_Serial",0);
                            if (iVar2 == 0) {
                              lVar16 = N_VGetArrayPointer();
                              uVar1 = *(uint *)((long)returnvalue + 0x40);
                              iVar2 = *(int *)((long)returnvalue + 0x44);
                              dVar18 = 0.0;
                              if (0 < (int)uVar1) {
                                dVar18 = (double)(ulong)uVar1;
                              }
                              for (; dVar18 != local_a0; local_a0 = (double)((long)local_a0 + 1)) {
                                (&indexB + (long)local_a0 * 2)[0] = 0;
                                (&indexB + (long)local_a0 * 2)[1] = 0;
                              }
                              local_40 = 0x3ff0000000000000;
                              for (lVar7 = 0; lVar7 != 0x14; lVar7 = lVar7 + 1) {
                                lVar5 = lVar16;
                                for (lVar10 = 0; lVar10 != 0x14; lVar10 = lVar10 + 1) {
                                  for (dVar19 = 0.0; dVar18 != dVar19;
                                      dVar19 = (double)((long)dVar19 + 1)) {
                                    *(undefined8 *)(lVar5 + (long)dVar19 * 8) =
                                         *(undefined8 *)(&indexB + (long)dVar19 * 2);
                                  }
                                  lVar5 = lVar5 + (long)(int)uVar1 * 8;
                                }
                                lVar16 = lVar16 + (long)iVar2 * 8;
                              }
                              puts("\nCreate and allocate CVODES memory for backward run");
                              retval = CVodeCreateB(returnvalue_01,2,&indexB);
                              iVar9 = 1;
                              iVar2 = check_retval(&retval,"CVodeCreateB",1);
                              if (iVar2 == 0) {
                                retval = CVodeSetUserDataB(returnvalue_01,indexB,returnvalue);
                                iVar9 = 1;
                                iVar2 = check_retval(&retval,"CVodeSetUserDataB",1);
                                if (iVar2 == 0) {
                                  retval = CVodeInitB(0,returnvalue_01,indexB,fB,local_98);
                                  iVar9 = 1;
                                  iVar2 = check_retval(&retval,"CVodeInitB",1);
                                  if (iVar2 == 0) {
                                    retval = CVodeSStolerancesB(0x88e368f1,0x3ee4f8b588e368f1,
                                                                returnvalue_01,indexB);
                                    iVar9 = 1;
                                    iVar2 = check_retval(&retval,"CVodeSStolerancesB",1);
                                    if (iVar2 == 0) {
                                      *(int *)((long)returnvalue + 0x9940) = indexB;
                                      iVar9 = 1;
                                      returnvalue_03 = (void *)SUNLinSol_SPGMR(local_98,1,0,sunctx);
                                      iVar2 = check_retval(returnvalue_03,"SUNLinSol_SPGMR",0);
                                      if (iVar2 == 0) {
                                        retval = CVodeSetLinearSolverB
                                                           (returnvalue_01,indexB,returnvalue_03,0);
                                        iVar9 = 1;
                                        iVar2 = check_retval(&retval,"CVodeSetLinearSolverB",1);
                                        if (iVar2 == 0) {
                                          retval = CVodeSetPreconditionerB
                                                             (returnvalue_01,indexB,PrecondB,PSolveB
                                                             );
                                          iVar9 = 1;
                                          iVar2 = check_retval(&retval,"CVodeSetPreconditionerB",1);
                                          if (iVar2 == 0) {
                                            puts("\nBackward integration");
                                            iVar9 = 1;
                                            retval = CVodeB(0,returnvalue_01,1);
                                            iVar2 = check_retval(&retval,"CVodeB",1);
                                            if (iVar2 == 0) {
                                              retval = CVodeGetB(returnvalue_01,indexB,&t,local_98);
                                              iVar9 = 1;
                                              iVar2 = check_retval(&retval,"CVodeGetB",1);
                                              if (iVar2 == 0) {
                                                lVar16 = N_VGetArrayPointer(local_98);
                                                pdVar14 = (double *)(lVar16 + 0x4740);
                                                local_88 = 0.0;
                                                dStack_80 = 0.0;
                                                for (lVar16 = 1; lVar16 != 7; lVar16 = lVar16 + 1) {
                                                  local_a0 = 0.0;
                                                  pdVar4 = pdVar14;
                                                  for (lVar7 = 0x13; -1 < lVar7; lVar7 = lVar7 + -1)
                                                  {
                                                    pdVar8 = pdVar4;
                                                    for (lVar5 = 0; lVar5 != 0x14; lVar5 = lVar5 + 1
                                                        ) {
                                                      if (local_a0 < ABS(*pdVar8)) {
                                                        local_88 = *(double *)
                                                                    ((long)returnvalue + 0x310) *
                                                                   (double)(int)lVar5;
                                                        dStack_80 = *(double *)
                                                                     ((long)returnvalue + 0x318) *
                                                                    (double)(int)lVar7;
                                                        local_a0 = *pdVar8;
                                                      }
                                                      pdVar8 = pdVar8 + 6;
                                                    }
                                                    pdVar4 = pdVar4 + -0x78;
                                                  }
                                                  printf(
                                                  "\nMaximum sensitivity with respect to I.C. of species %d\n"
                                                  );
                                                  printf("  mu max = %e\n",SUB84(local_a0,0));
                                                  puts("at");
                                                  printf("  x = %e\n  y = %e\n",SUB84(local_88,0),
                                                         dStack_80);
                                                  pdVar14 = pdVar14 + 1;
                                                }
                                                CVodeFree(&local_78);
                                                N_VDestroy(returnvalue_00);
                                                N_VDestroy(local_98);
                                                SUNLinSolFree(returnvalue_02);
                                                SUNLinSolFree(returnvalue_03);
                                                SUNContext_Free(&sunctx);
                                                uVar17 = 0;
                                                uVar11 = (ulong)*(uint *)((long)returnvalue + 0x58);
                                                if ((int)*(uint *)((long)returnvalue + 0x58) < 1) {
                                                  uVar11 = uVar17;
                                                }
                                                for (; uVar11 != uVar17; uVar17 = uVar17 + 1) {
                                                  SUNDlsMat_destroyMat
                                                            (*(undefined8 *)
                                                              ((long)returnvalue + uVar17 * 8));
                                                  SUNDlsMat_destroyArray
                                                            (*(undefined8 *)
                                                              ((long)returnvalue + uVar17 * 8 + 0x20
                                                              ));
                                                }
                                                N_VDestroy(*(undefined8 *)
                                                            ((long)returnvalue + 0x9928));
                                                N_VDestroy(*(undefined8 *)
                                                            ((long)returnvalue + 0x9930));
                                                free(returnvalue);
                                                iVar9 = 0;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

int main(int argc, char* argv[])
{
  sunrealtype abstol = ATOL, reltol = RTOL, t;
  N_Vector c;
  WebData wdata;
  void* cvode_mem;
  SUNLinearSolver LS, LSB;

  int retval, ncheck;

  int indexB;

  sunrealtype reltolB = RTOL, abstolB = ATOL;
  N_Vector cB;

  c         = NULL;
  cB        = NULL;
  wdata     = NULL;
  cvode_mem = NULL;
  LS = LSB = NULL;

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate and initialize user data */

  wdata = AllocUserData();
  if (check_retval((void*)wdata, "AllocUserData", 2)) { return (1); }
  InitUserData(wdata);

  /* Set-up forward problem */

  /* Initializations */
  c = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)c, "N_VNew_Serial", 0)) { return (1); }
  CInit(c, wdata);

  /* Call CVodeCreate/CVodeInit for forward run */
  printf("\nCreate and allocate CVODES memory for forward run\n");
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }
  wdata->cvode_mem = cvode_mem; /* Used in Precond */
  retval           = CVodeSetUserData(cvode_mem, wdata);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }
  retval = CVodeInit(cvode_mem, f, T0, c);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create SUNLinSol_SPGMR linear solver for forward run */
  LS = SUNLinSol_SPGMR(c, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Attach the linear sovler */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
  if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

  /* Call CVodeSetMaxNumSteps to set the maximum number of steps the
   * solver will take in an attempt to reach the next output time
   * during forward integration. */
  retval = CVodeSetMaxNumSteps(cvode_mem, 2500);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Set-up adjoint calculations */

  printf("\nAllocate global memory\n");
  retval = CVodeAdjInit(cvode_mem, NSTEPS, CV_HERMITE);
  if (check_retval(&retval, "CVodeAdjInit", 1)) { return (1); }

  /* Perform forward run */

  printf("\nForward integration\n");
  retval = CVodeF(cvode_mem, TOUT, c, &t, CV_NORMAL, &ncheck);
  if (check_retval(&retval, "CVodeF", 1)) { return (1); }

  printf("\nncheck = %d\n", ncheck);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("\n   g = int_x int_y c%d(Tfinal,x,y) dx dy = %Lf \n\n", ISPEC,
         doubleIntgr(c, ISPEC, wdata));
#else
  printf("\n   g = int_x int_y c%d(Tfinal,x,y) dx dy = %f \n\n", ISPEC,
         doubleIntgr(c, ISPEC, wdata));
#endif

  /* Set-up backward problem */

  /* Allocate cB */
  cB = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)cB, "N_VNew_Serial", 0)) { return (1); }
  /* Initialize cB = 0 */
  CbInit(cB, ISPEC, wdata);

  /* Create and allocate CVODES memory for backward run */
  printf("\nCreate and allocate CVODES memory for backward run\n");
  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }
  retval = CVodeSetUserDataB(cvode_mem, indexB, wdata);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }
  retval = CVodeInitB(cvode_mem, indexB, fB, TOUT, cB);
  if (check_retval(&retval, "CVodeInitB", 1)) { return (1); }
  retval = CVodeSStolerancesB(cvode_mem, indexB, reltolB, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  wdata->indexB = indexB;

  /* Create SUNLinSol_SPGMR linear solver for backward run */
  LSB = SUNLinSol_SPGMR(cB, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LSB, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Attach the linear sovler */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB, LSB, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return 1; }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditionerB(cvode_mem, indexB, PrecondB, PSolveB);
  if (check_retval(&retval, "CVodeSetPreconditionerB", 1)) { return (1); }

  /* Perform backward integration */

  printf("\nBackward integration\n");
  retval = CVodeB(cvode_mem, T0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &t, cB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  PrintOutput(cB, NS, MXNS, wdata);

  /* Free all memory */
  CVodeFree(&cvode_mem);

  N_VDestroy(c);
  N_VDestroy(cB);
  SUNLinSolFree(LS);
  SUNLinSolFree(LSB);
  SUNContext_Free(&sunctx);
  FreeUserData(wdata);

  return (0);
}